

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::appentries_dir(void)

{
  Path *in_RDI;
  allocator local_51;
  string local_50 [32];
  Path local_30;
  
  data_dir();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"applications",&local_51);
  join(in_RDI,&local_30,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  ~Path(&local_30);
  return in_RDI;
}

Assistant:

Path Path::appentries_dir()
{
#if defined(_PATHIE_UNIX)
  return data_dir().join("applications");
#elif defined(_WIN32)
  wchar_t dir[MAX_PATH];
  HRESULT result = SHGetFolderPathW(NULL, CSIDL_STARTMENU, NULL, SHGFP_TYPE_CURRENT, dir);
  if (result != S_OK)
    throw(Pathie::WindowsHresultError(result));

  return Path(utf16_to_utf8(dir));
#else
#error Unsupported system.
#endif
}